

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmImplicitCtor::gen_code(CTPNStmImplicitCtor *this,int param_2,int param_3)

{
  tc_symtype_t tVar1;
  CTcSymObjBase *this_00;
  size_t in_RCX;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  long in_RDI;
  CTcSymObj *sc_sym;
  CTPNSuperclass *sc;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  CTcCodeStream *this_01;
  CTPNSuperclass *local_18;
  
  for (local_18 = CTPNObjDef::get_first_sc((CTPNObjDef *)(*(long *)(in_RDI + 0x20) + 0x30));
      local_18 != (CTPNSuperclass *)0x0; local_18 = local_18->nxt_) {
    this_00 = (CTcSymObjBase *)
              CTPNSuperclass::get_sym
                        ((CTPNSuperclass *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (this_00 != (CTcSymObjBase *)0x0) {
      tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00);
      if (tVar1 == TC_SYM_OBJ) {
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        CTcGenTarg::note_push((CTcGenTarg *)0x28bbe5);
        CTcSymLocal::s_gen_code_getlcl(0,0x28bbee);
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        CTcGenTarg::note_push((CTcGenTarg *)0x28bc11);
        CTcGenTarg::note_pop((CTcGenTarg *)0x28bc20);
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
        CTcDataStream::write
                  (&G_cs->super_CTcDataStream,0,(void *)CONCAT44(extraout_var,extraout_EDX),in_RCX);
        this_01 = G_cs;
        CTcParser::get_constructor_prop(G_prs);
        CTcDataStream::write_prop_id(&this_01->super_CTcDataStream,in_stack_ffffffffffffffcc);
        CTcSymObjBase::get_obj_id(this_00);
        CTcDataStream::write_obj_id
                  (&this_01->super_CTcDataStream,
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        CTcGenTarg::note_pop(G_cg,2);
      }
    }
  }
  return;
}

Assistant:

void CTPNStmImplicitCtor::gen_code(int /*discard*/, int /*for_condition*/)
{
    /* 
     *   Generate a call to inherit each superclass constructor.  Pass the
     *   same argument list we received by expanding the varargs list
     *   parameter in local 0.  
     */
    for (CTPNSuperclass *sc = obj_stm_->get_first_sc() ; sc != 0 ;
         sc = sc->nxt_)
    {
        /* 
         *   if this one is valid, generate code to call its constructor -
         *   it's valid if it has an object symbol 
         */
        CTcSymObj *sc_sym = (CTcSymObj *)sc->get_sym();
        if (sc_sym != 0 && sc_sym->get_type() == TC_SYM_OBJ)
        {
            /* push the argument counter so far (no other arguments) */
            G_cg->write_op(OPC_PUSH_0);
            G_cg->note_push();

            /* get the varargs list local */
            CTcSymLocal::s_gen_code_getlcl(0, FALSE);

            /* convert it to varargs */
            G_cg->write_op(OPC_MAKELSTPAR);

            /* note the extra push and pop for the argument count */
            G_cg->note_push();
            G_cg->note_pop();

            /* it's a varargs call */
            G_cg->write_op(OPC_VARARGC);

            /* generate an EXPINHERIT to this superclass */
            G_cg->write_op(OPC_EXPINHERIT);
            G_cs->write(0);                      /* varargs -> argc ignored */
            G_cs->write_prop_id(G_prs->get_constructor_prop());
            G_cs->write_obj_id(sc_sym->get_obj_id());

            /* 
             *   this removes arguments (the varargs list variable and
             *   argument count) 
             */
            G_cg->note_pop(2);
        }
    }
}